

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::all2allv_big<std::pair<unsigned_long,unsigned_long>>
               (pair<unsigned_long,_unsigned_long> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_displs,
               pair<unsigned_long,_unsigned_long> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_displs,comm *comm)

{
  unsigned_long uVar1;
  MPI_Comm poVar2;
  ulong uVar3;
  MPI_Datatype poVar4;
  int iVar5;
  MPI_Request *ppoVar6;
  int iVar7;
  int iVar8;
  char *__stat_loc;
  datatype dt_1;
  datatype dt;
  requests reqs;
  
  iVar5 = (int)((ulong)((long)(send_sizes->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(send_sizes->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  __stat_loc = (char *)send_sizes;
  if (comm->m_size != iVar5) {
    __stat_loc = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
    ;
    assert_fail("static_cast<int>(send_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
                ,0x131,"all2allv_big");
    iVar5 = comm->m_size;
  }
  if (iVar5 != (int)((ulong)((long)(recv_sizes->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(recv_sizes->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    __stat_loc = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
    ;
    assert_fail("static_cast<int>(recv_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
                ,0x132,"all2allv_big");
  }
  reqs._vptr_requests = (_func_int **)&PTR__requests_0016f320;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = 0;
  for (iVar5 = 0; iVar8 = comm->m_size, iVar5 < iVar8; iVar5 = iVar5 + 1) {
    uVar3 = (long)(comm->m_rank + iVar8 + iVar7) % (long)iVar8;
    dt_1.mpitype = datatype_builder<std::pair<unsigned_long,_unsigned_long>_>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_0016f1e0;
    dt_1.builtin = false;
    iVar8 = (int)uVar3;
    datatype::contiguous
              (&dt,&dt_1,
               (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start[iVar8]);
    datatype::~datatype(&dt_1);
    poVar4 = dt.mpitype;
    uVar1 = (recv_displs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start[iVar8];
    poVar2 = comm->mpi_comm;
    ppoVar6 = requests::add(&reqs);
    __stat_loc = (char *)0x1;
    MPI_Irecv(out + uVar1,1,poVar4,uVar3 & 0xffffffff,0x3039,poVar2,ppoVar6);
    datatype::~datatype(&dt);
    iVar7 = iVar7 + -1;
  }
  for (iVar5 = 0; iVar5 < iVar8; iVar5 = iVar5 + 1) {
    uVar3 = (long)(comm->m_rank + iVar5) % (long)iVar8;
    dt_1.mpitype = datatype_builder<std::pair<unsigned_long,_unsigned_long>_>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_0016f1e0;
    dt_1.builtin = false;
    iVar7 = (int)uVar3;
    datatype::contiguous
              (&dt,&dt_1,
               (send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start[iVar7]);
    datatype::~datatype(&dt_1);
    poVar4 = dt.mpitype;
    uVar1 = (send_displs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start[iVar7];
    poVar2 = comm->mpi_comm;
    ppoVar6 = requests::add(&reqs);
    __stat_loc = (char *)0x1;
    MPI_Isend(msgs + uVar1,1,poVar4,uVar3 & 0xffffffff,0x3039,poVar2,ppoVar6);
    datatype::~datatype(&dt);
    iVar8 = comm->m_size;
  }
  requests::wait(&reqs,__stat_loc);
  requests::~requests(&reqs);
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& send_displs, T* out, const std::vector<size_t>& recv_sizes, const std::vector<size_t>& recv_displs, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}